

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlDataModel.c
# Opt level: O0

JL_STATUS JlGetObjectNumberS64(JlDataObject *NumberObject,int64_t *pNumberS64)

{
  JL_STATUS local_1c;
  JL_STATUS jlStatus;
  int64_t *pNumberS64_local;
  JlDataObject *NumberObject_local;
  
  if ((NumberObject == (JlDataObject *)0x0) || (pNumberS64 == (int64_t *)0x0)) {
    local_1c = JL_STATUS_INVALID_PARAMETER;
  }
  else if ((NumberObject->Type == JL_DATA_TYPE_NUMBER) &&
          ((NumberObject->field_2).Number.Type == JL_NUM_TYPE_SIGNED)) {
    *pNumberS64 = (int64_t)(NumberObject->field_2).Number.field_1;
    local_1c = JL_STATUS_SUCCESS;
  }
  else if ((NumberObject->Type == JL_DATA_TYPE_NUMBER) &&
          (((NumberObject->field_2).Number.Type == JL_NUM_TYPE_UNSIGNED &&
           ((NumberObject->field_2).List.ListHead < (JlListItem *)0x8000000000000000)))) {
    *pNumberS64 = (int64_t)(NumberObject->field_2).Number.field_1;
    local_1c = JL_STATUS_SUCCESS;
  }
  else if (NumberObject->Type == JL_DATA_TYPE_NUMBER) {
    *pNumberS64 = 0;
    local_1c = JL_STATUS_VALUE_OUT_OF_RANGE;
  }
  else {
    *pNumberS64 = 0;
    local_1c = JL_STATUS_WRONG_TYPE;
  }
  return local_1c;
}

Assistant:

JL_STATUS
    JlGetObjectNumberS64
    (
        JlDataObject const* NumberObject,
        int64_t*            pNumberS64
    )
{
    JL_STATUS jlStatus;

    if(     NULL != NumberObject
        &&  NULL != pNumberS64 )
    {
        if(     JL_DATA_TYPE_NUMBER == NumberObject->Type
            &&  JL_NUM_TYPE_SIGNED == NumberObject->Number.Type )
        {
            // Number stored as a signed integer. Easy.
            *pNumberS64 = NumberObject->Number.s64;
            jlStatus = JL_STATUS_SUCCESS;
        }
        else if(     JL_DATA_TYPE_NUMBER == NumberObject->Type
            &&  JL_NUM_TYPE_UNSIGNED == NumberObject->Number.Type
            &&  NumberObject->Number.u64 <= INT64_MAX )
        {
            // Number is stored as unsigned number but it is smaller than INT64_MAX so it can be represented
            // in a signed 64 bit number
            *pNumberS64 = NumberObject->Number.u64;
            jlStatus = JL_STATUS_SUCCESS;
        }
        else if( JL_DATA_TYPE_NUMBER == NumberObject->Type )
        {
            // Wrong type of number
            *pNumberS64 = 0;
            jlStatus = JL_STATUS_VALUE_OUT_OF_RANGE;
        }
        else
        {
            *pNumberS64 = 0;
            jlStatus = JL_STATUS_WRONG_TYPE;
        }
    }
    else
    {
        jlStatus = JL_STATUS_INVALID_PARAMETER;
    }

    return jlStatus;
}